

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

bool __thiscall
cmCTestRunTest::ForkProcess
          (cmCTestRunTest *this,cmDuration testTimeOut,bool explicitTimeout,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *environment,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *environment_modification,vector<unsigned_long,_std::allocator<unsigned_long>_> *affinity)

{
  string *this_00;
  cmProcess *this_01;
  cmCTest *this_02;
  pointer pbVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  byte bVar5;
  iterator __begin2;
  pointer envmod;
  iterator __end2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var;
  string *psVar6;
  cmDuration cVar7;
  cmDuration timeout;
  double local_200;
  EnvDiff diff;
  SaveRestoreEnvironment sre;
  ostringstream envMeasurement;
  
  this_01 = (this->TestProcess)._M_t.
            super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
            super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
            super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl;
  this_01->Id = this->Index;
  cmProcess::SetWorkingDirectory(this_01,&this->TestProperties->Directory);
  cmProcess::SetCommand
            ((this->TestProcess)._M_t.
             super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
             super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
             super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl,&this->ActualCommand);
  cmProcess::SetCommandArguments
            ((this->TestProcess)._M_t.
             super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
             super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
             super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl,&this->Arguments);
  local_200 = (double)cmCTest::GetRemainingTimeAllowed(this->CTest);
  timeout.__r = local_200;
  cVar7 = cmCTest::MaxDuration();
  if ((local_200 != cVar7.__r) || (NAN(local_200) || NAN(cVar7.__r))) {
    timeout.__r = local_200 + -120.0;
    local_200 = timeout.__r;
  }
  cVar7 = cmCTest::GetTimeOut(this->CTest);
  if ((0.0 < cVar7.__r) && (cVar7 = cmCTest::GetTimeOut(this->CTest), cVar7.__r < local_200)) {
    local_200 = (double)cmCTest::GetTimeOut(this->CTest);
    timeout = (cmDuration)local_200;
  }
  if ((0.0 < testTimeOut.__r) &&
     (cVar7 = cmCTest::GetRemainingTimeAllowed(this->CTest), testTimeOut.__r < cVar7.__r)) {
    local_200 = testTimeOut.__r;
    timeout.__r = testTimeOut.__r;
  }
  if (local_200 <= 0.0) {
    timeout.__r = 1.0;
  }
  if (explicitTimeout && testTimeOut.__r == 0.0) {
    timeout.__r = 0.0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&envMeasurement);
  poVar4 = (ostream *)std::ostream::operator<<((ostringstream *)&envMeasurement,this->Index);
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = std::operator<<(poVar4,"Test timeout computed to be: ");
  cmDurationTo<unsigned_int>(&timeout);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,"\n");
  this_02 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_02,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x30e,(char *)diff.diff._M_t._M_impl._0_8_,
               (this->TestHandler->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&diff);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&envMeasurement);
  (((this->TestProcess)._M_t.super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
    super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
    super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl)->Timeout).__r = timeout.__r;
  cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(&sre);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&envMeasurement);
  if ((environment !=
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0) &&
     ((environment->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (environment->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &diff.diff._M_t._M_impl.super__Rb_tree_header._M_header;
    diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    diff.diff._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    cmSystemTools::EnvDiff::AppendEnv(&diff,environment);
    cmSystemTools::EnvDiff::ApplyToCurrentEnv(&diff,&envMeasurement);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&diff);
  }
  if (environment_modification !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    envmod = (environment_modification->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (environment_modification->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (envmod != pbVar1) {
      diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &diff.diff._M_t._M_impl.super__Rb_tree_header._M_header;
      diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      diff.diff._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      bVar5 = 1;
      diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (; envmod != pbVar1; envmod = envmod + 1) {
        bVar3 = cmSystemTools::EnvDiff::ParseOperation(&diff,envmod);
        bVar5 = bVar5 & bVar3;
      }
      if (bVar5 == 0) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&diff);
        bVar3 = false;
        goto LAB_00487b3f;
      }
      cmSystemTools::EnvDiff::ApplyToCurrentEnv(&diff,&envMeasurement);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&diff);
    }
  }
  if (this->UseAllocatedResources == true) {
    diff.diff._M_t._M_impl._0_8_ = 0;
    diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    SetupResourcesEnvironment
              (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&diff);
    uVar2 = diff.diff._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
    for (psVar6 = (string *)diff.diff._M_t._M_impl._0_8_; psVar6 != (string *)uVar2;
        psVar6 = psVar6 + 0x20) {
      poVar4 = std::operator<<((ostream *)&envMeasurement,psVar6);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&diff);
  }
  else {
    cmSystemTools::UnsetEnv("CTEST_RESOURCE_GROUP_COUNT");
    poVar4 = std::operator<<((ostream *)&envMeasurement,"#CTEST_RESOURCE_GROUP_COUNT=");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::stringbuf::str();
  this_00 = &(this->TestResult).Environment;
  std::__cxx11::string::operator=((string *)this_00,(string *)&diff);
  std::__cxx11::string::~string((string *)&diff);
  std::__cxx11::string::erase((ulong)this_00,(this->TestResult).Environment._M_string_length - 1);
  bVar3 = cmProcess::StartProcess
                    ((this->TestProcess)._M_t.
                     super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
                     super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
                     super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl,
                     &this->MultiTestHandler->Loop,affinity);
LAB_00487b3f:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&envMeasurement);
  cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment(&sre);
  return bVar3;
}

Assistant:

bool cmCTestRunTest::ForkProcess(
  cmDuration testTimeOut, bool explicitTimeout,
  std::vector<std::string>* environment,
  std::vector<std::string>* environment_modification,
  std::vector<size_t>* affinity)
{
  this->TestProcess->SetId(this->Index);
  this->TestProcess->SetWorkingDirectory(this->TestProperties->Directory);
  this->TestProcess->SetCommand(this->ActualCommand);
  this->TestProcess->SetCommandArguments(this->Arguments);

  // determine how much time we have
  cmDuration timeout = this->CTest->GetRemainingTimeAllowed();
  if (timeout != cmCTest::MaxDuration()) {
    timeout -= std::chrono::minutes(2);
  }
  if (this->CTest->GetTimeOut() > cmDuration::zero() &&
      this->CTest->GetTimeOut() < timeout) {
    timeout = this->CTest->GetTimeOut();
  }
  if (testTimeOut > cmDuration::zero() &&
      testTimeOut < this->CTest->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }
  // always have at least 1 second if we got to here
  if (timeout <= cmDuration::zero()) {
    timeout = std::chrono::seconds(1);
  }
  // handle timeout explicitly set to 0
  if (testTimeOut == cmDuration::zero() && explicitTimeout) {
    timeout = cmDuration::zero();
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     this->Index << ": "
                                 << "Test timeout computed to be: "
                                 << cmDurationTo<unsigned int>(timeout)
                                 << "\n",
                     this->TestHandler->GetQuiet());

  this->TestProcess->SetTimeout(timeout);

  cmSystemTools::SaveRestoreEnvironment sre;
  std::ostringstream envMeasurement;

  // We split processing ENVIRONMENT and ENVIRONMENT_MODIFICATION into two
  // phases to ensure that MYVAR=reset: in the latter phase resets to the
  // former phase's settings, rather than to the original environment.
  if (environment && !environment->empty()) {
    cmSystemTools::EnvDiff diff;
    diff.AppendEnv(*environment);
    diff.ApplyToCurrentEnv(&envMeasurement);
  }

  if (environment_modification && !environment_modification->empty()) {
    cmSystemTools::EnvDiff diff;
    bool env_ok = true;

    for (auto const& envmod : *environment_modification) {
      env_ok &= diff.ParseOperation(envmod);
    }

    if (!env_ok) {
      return false;
    }

    diff.ApplyToCurrentEnv(&envMeasurement);
  }

  if (this->UseAllocatedResources) {
    std::vector<std::string> envLog;
    this->SetupResourcesEnvironment(&envLog);
    for (auto const& var : envLog) {
      envMeasurement << var << std::endl;
    }
  } else {
    cmSystemTools::UnsetEnv("CTEST_RESOURCE_GROUP_COUNT");
    // Signify that this variable is being actively unset
    envMeasurement << "#CTEST_RESOURCE_GROUP_COUNT=" << std::endl;
  }

  this->TestResult.Environment = envMeasurement.str();
  // Remove last newline
  this->TestResult.Environment.erase(this->TestResult.Environment.length() -
                                     1);

  return this->TestProcess->StartProcess(this->MultiTestHandler.Loop,
                                         affinity);
}